

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O1

void __thiscall Texture::Texture(Texture *this,char *img)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  stbi_uc *psVar4;
  float *pfVar5;
  size_t sVar6;
  ostream *poVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int k;
  int iVar12;
  long lVar13;
  float fVar14;
  HDRLoaderResult result;
  string img_;
  HDRLoaderResult local_80;
  undefined1 local_70 [16];
  char *local_60;
  ulong local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->type = TEXTURE_RECT;
  Vector3f::Vector3f(&this->color,0.0);
  *(undefined8 *)&(this->scale).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->scale).super__Function_base._M_functor + 8) = 0;
  (this->scale).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->scale)._M_invoker = (_Invoker_type)0x0;
  this->empty = false;
  std::__cxx11::string::string((string *)local_50,img,(allocator *)&local_80);
  std::__cxx11::string::substr((ulong)&local_80,(ulong)local_50);
  iVar2 = std::__cxx11::string::compare((char *)&local_80);
  if ((undefined1 *)CONCAT44(local_80.height,local_80.width) != local_70) {
    operator_delete((undefined1 *)CONCAT44(local_80.height,local_80.width));
  }
  if (iVar2 == 0) {
    this->image_buff_stbi = (uchar *)0x0;
    bVar1 = HDRLoader::load(img,&local_80);
    iVar2 = local_80.height;
    if (!bVar1) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/texture.h"
                    ,0x22,"Texture::Texture(const char *)");
    }
    iVar3 = (local_80.width / 2) * local_80.height;
    uVar9 = 0xffffffffffffffff;
    if (-2 < iVar3) {
      uVar9 = (long)((iVar3 / 2) * 3) << 2;
    }
    pfVar5 = (float *)operator_new__(uVar9);
    this->hdr_buff = pfVar5;
    this->image_w = local_80.width / 2;
    this->image_h = iVar2 / 2;
    this->image_c = 3;
    local_60 = img;
    if (1 < local_80.width) {
      iVar3 = 0;
      iVar2 = 0;
      do {
        if (0 < this->image_h) {
          uVar9 = 0;
          lVar13 = 0;
          do {
            iVar12 = 0;
            local_58 = uVar9;
            do {
              iVar8 = iVar3 * local_80.height + (int)uVar9;
              fVar14 = 0.0;
              iVar10 = 0;
              do {
                lVar11 = 0;
                do {
                  fVar14 = fVar14 + local_80.cols[iVar8 + (int)lVar11];
                  lVar11 = lVar11 + 3;
                } while (lVar11 == 3);
                iVar8 = iVar8 + local_80.height * 3;
                bVar1 = iVar10 == 0;
                iVar10 = iVar10 + 1;
              } while (bVar1);
              fVar14 = powf(fVar14 * 0.25,0.1);
              this->hdr_buff[(this->image_h * iVar2 + (int)lVar13) * 3 + iVar12] = fVar14;
              iVar12 = iVar12 + 1;
              uVar9 = (ulong)((int)uVar9 + 1);
            } while (iVar12 != 3);
            lVar13 = lVar13 + 1;
            uVar9 = (ulong)((int)local_58 + 6);
          } while (lVar13 < this->image_h);
        }
        iVar2 = iVar2 + 1;
        iVar3 = iVar3 + 6;
        img = local_60;
      } while (iVar2 < this->image_w);
    }
  }
  else {
    this->hdr_buff = (float *)0x0;
    psVar4 = stbi_load(img,&this->image_w,&this->image_h,&this->image_c,0);
    this->image_buff_stbi = psVar4;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"loaded image ",0xd);
  if (img == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2fc8770);
  }
  else {
    sVar6 = strlen(img);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,img,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,this->image_w);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->image_h);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->image_c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

Texture(const char* img) :type(TEXTURE_RECT)
	{
		std::string img_ = img;
		if (img_.substr(img_.size() - 4) == ".hdr") {
			image_buff_stbi = nullptr;
			HDRLoaderResult result;
			bool ret = HDRLoader::load(img, result);
			assert(ret);
			hdr_buff = new float[result.width / 2 * result.height / 2 * 3];
			image_w = result.width/2;
			image_h = result.height/2;
			image_c = 3;
			for(int i=0;i<image_w;++i)
				for(int j=0;j<image_h;++j)
					for (int k = 0; k < 3; ++k)
					{
						float s = 0;
						for (int w = 0; w < 2; ++w)
							for (int g = 0; g < 2; ++g)
								s += result.cols[(i * 2 + w) * result.height * 3 + (j * 2 + g) * 3 + k];
						hdr_buff[i * image_h * 3 + j * 3 + k] = powf(s / 4, 0.1);
					}
		}
		else {
			hdr_buff = nullptr;
			image_buff_stbi = stbi_load(img, &image_w, &image_h, &image_c, 0);
		}
		std::cerr << "loaded image " << img << ": " << image_w << "x" << image_h << "x" << image_c << "\n";
	}